

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpsrv.cpp
# Opt level: O3

int __thiscall
CVmObjHTTPServer::getp_shutdown
          (CVmObjHTTPServer *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int __fd;
  bool bVar4;
  bool bVar5;
  
  if (oargc == (uint *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = *oargc == 0;
  }
  if (getp_shutdown(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_shutdown();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_shutdown::desc);
  __fd = (int)oargc;
  if (iVar3 == 0) {
    bVar5 = true;
    iVar3 = extraout_EDX;
    if (!bVar4) {
      iVar3 = CVmBif::pop_bool_val();
      bVar5 = iVar3 == 0;
      iVar3 = extraout_EDX_00;
    }
    plVar2 = (long *)(this->super_CVmObject).ext_;
    if ((plVar2 == (long *)0x0) || (*plVar2 == 0)) {
      retval->typ = VM_TRUE;
    }
    else {
      LOCK();
      plVar1 = (long *)(*plVar2 + 8);
      *plVar1 = *plVar1 + 1;
      UNLOCK();
      TadsListener::shutdown((TadsListener *)*plVar2,__fd,iVar3);
      if (!bVar5) {
        OS_Waitable::wait((OS_Waitable *)(*(long *)(*plVar2 + 0x10) + 0x20),
                          (void *)0xffffffffffffffff);
      }
      iVar3 = OS_Waitable::test((OS_Waitable *)(*(long *)(*plVar2 + 0x10) + 0x20));
      retval->typ = VM_TRUE - (iVar3 == 0);
      plVar2 = (long *)*plVar2;
      LOCK();
      plVar1 = plVar2 + 1;
      *plVar1 = *plVar1 + -1;
      UNLOCK();
      if (*plVar1 == 0) {
        (**(code **)(*plVar2 + 8))();
      }
    }
  }
  return 1;
}

Assistant:

int CVmObjHTTPServer::getp_shutdown(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* check arguments */
    int wait = FALSE;
    if (argc >= 1)
        wait = CVmBif::pop_bool_val(vmg0_);

    /* if we have a listener, tell it to shut down */
    vm_httpsrv_ext *ext = get_ext();
    if (ext != 0 && ext->l != 0)
    {
        /* add a reference on the listener while we're using it */
        ext->l->add_ref();
        
        /* shut down the server */
        ext->l->shutdown();

        /* if we're waiting, wait for the listener thread to exit */
        if (wait)
            ext->l->get_thread()->wait();

        /* 
         *   Return true if the thread is done, nil if it's still running.
         *   The main listener thread waits for all of its launched server
         *   threads to exit before it itself exits, so once the listener
         *   thread is done, we can be sure that all of its launched threads
         *   are done as well. 
         */
        retval->set_logical(ext->l->get_thread()->test());

        /* done with the listener */
        ext->l->release_ref();
    }
    else
    {
        /* there is no server, so it's already shut down */
        retval->set_true();
    }

    /* handled */
    return TRUE;
}